

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem-disk-unix.c++
# Opt level: O0

void __thiscall
kj::anon_unknown_8::DiskHandle::ReplacerImpl<kj::File>::ReplacerImpl
          (ReplacerImpl<kj::File> *this,Own<const_kj::File> *object,DiskHandle *handle,
          String *tempPath,String *path,WriteMode mode)

{
  Own<const_kj::File> *other;
  String *pSVar1;
  WriteMode mode_local;
  String *path_local;
  String *tempPath_local;
  DiskHandle *handle_local;
  Own<const_kj::File> *object_local;
  ReplacerImpl<kj::File> *this_local;
  
  Directory::Replacer<kj::File>::Replacer(&this->super_Replacer<kj::File>,mode);
  (this->super_Replacer<kj::File>)._vptr_Replacer = (_func_int **)&PTR_get_004ae7e0;
  other = mv<kj::Own<kj::File_const>>(object);
  Own<const_kj::File>::Own(&this->object,other);
  this->handle = handle;
  pSVar1 = mv<kj::String>(tempPath);
  String::String(&this->tempPath,pSVar1);
  pSVar1 = mv<kj::String>(path);
  String::String(&this->path,pSVar1);
  this->committed = false;
  return;
}

Assistant:

ReplacerImpl(Own<const T>&& object, const DiskHandle& handle,
                 String&& tempPath, String&& path, WriteMode mode)
        : Directory::Replacer<T>(mode),
          object(kj::mv(object)), handle(handle),
          tempPath(kj::mv(tempPath)), path(kj::mv(path)) {}